

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_rkv.c
# Opt level: O2

MPP_RET hal_jpegd_rkv_deinit(void *hal)

{
  int level;
  MPP_RET MVar1;
  char *fmt;
  
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpegd_rkv","enter\n","hal_jpegd_rkv_deinit");
  }
  if (*(MppDev *)((long)hal + 0x10) != (MppDev)0x0) {
    mpp_dev_deinit(*(MppDev *)((long)hal + 0x10));
    *(undefined8 *)((long)hal + 0x10) = 0;
  }
  if ((*(MppBuffer *)((long)hal + 0x28) == (MppBuffer)0x0) ||
     (MVar1 = mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x28),"hal_jpegd_rkv_deinit"),
     MVar1 == MPP_OK)) {
    if ((*(MppBufferGroup *)((long)hal + 0x20) == (MppBufferGroup)0x0) ||
       (MVar1 = mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x20)), MVar1 == MPP_OK)) {
      if (*(void **)((long)hal + 0x18) != (void *)0x0) {
        mpp_osal_free("hal_jpegd_rkv_deinit",*(void **)((long)hal + 0x18));
        *(undefined8 *)((long)hal + 0x18) = 0;
      }
      *(undefined4 *)((long)hal + 0xa0) = 0;
      *(undefined8 *)((long)hal + 0x90) = 0;
      *(undefined8 *)((long)hal + 0x98) = 0;
      if (((byte)jpegd_debug & 1) == 0) {
        return MPP_OK;
      }
      fmt = "exit\n";
      MVar1 = MPP_OK;
      level = 4;
      goto LAB_00205ed4;
    }
    fmt = "group free buffer failed\n";
  }
  else {
    fmt = "put buffer failed\n";
  }
  level = 2;
LAB_00205ed4:
  _mpp_log_l(level,"hal_jpegd_rkv",fmt,"hal_jpegd_rkv_deinit");
  return MVar1;
}

Assistant:

MPP_RET hal_jpegd_rkv_deinit(void *hal)
{
    MPP_RET ret = MPP_OK;
    JpegdHalCtx *ctx = (JpegdHalCtx *)hal;

    jpegd_dbg_func("enter\n");

    if (ctx->dev) {
        mpp_dev_deinit(ctx->dev);
        ctx->dev = NULL;
    }

    if (ctx->pTableBase) {
        ret = mpp_buffer_put(ctx->pTableBase);
        if (ret) {
            mpp_err_f("put buffer failed\n");
            return ret;
        }
    }

    if (ctx->group) {
        ret = mpp_buffer_group_put(ctx->group);
        if (ret) {
            mpp_err_f("group free buffer failed\n");
            return ret;
        }
    }

    if (ctx->regs) {
        mpp_free(ctx->regs);
        ctx->regs = NULL;
    }

    ctx->output_fmt = MPP_FMT_YUV420SP;
    ctx->set_output_fmt_flag = 0;
    ctx->hal_debug_enable = 0;
    ctx->frame_count = 0;
    ctx->output_yuv_count = 0;

    jpegd_dbg_func("exit\n");
    return ret;
}